

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O0

void key_press_proc(Am_Object *self)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  Am_Value *pAVar4;
  ostream *poVar5;
  void *pvVar6;
  Am_Value *pAVar7;
  Am_Wrapper *pAVar8;
  Am_Point_List local_b8 [16];
  float local_a8;
  float local_a4;
  float y1;
  float x1;
  Am_Point_List pl;
  bool new_visible_1;
  bool new_visible;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  uint local_54;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  uint local_30;
  int c;
  Am_Input_Char local_1c;
  Am_Input_Char startc;
  Am_Object inter;
  Am_Object *self_local;
  
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe8,(Am_Slot_Flags)self);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)(Am_Object *)&stack0xffffffffffffffe8,0x11b);
  Am_Input_Char::Am_Input_Char(&local_1c,pAVar4);
  bVar1 = Am_Input_Char::As_Char();
  local_30 = (uint)bVar1;
  if (local_30 == 0x71) {
    Am_Exit_Main_Event_Loop();
  }
  else if (local_30 == 0x73) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x2498,100);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    if (iVar3 == 500) {
      Am_Object::Set(0x2498,100,0xaf);
      Am_Object::Set(0x2498,0x65,0x7d);
    }
    else {
      Am_Object::Set(0x2498,100,500);
      Am_Object::Set(0x2498,0x65,500);
    }
  }
  else if (local_30 == 0x61) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x24a0,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    Am_Object::Set(0x24a0,true,(ulong)((byte)~bVar2 & 1));
  }
  else if (local_30 == 0x66) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x24b8,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    Am_Object::Set(0x24b8,true,(ulong)((byte)~bVar2 & 1));
  }
  else if (local_30 == 0x68) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x24a8,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    Am_Object::Set(0x24a8,true,(ulong)((byte)~bVar2 & 1));
  }
  else if (local_30 == 0x77) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x24b0,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    Am_Object::Set(0x24b0,true,(ulong)((byte)~bVar2 & 1));
  }
  else if (local_30 == 0x65) {
    if ((key_press_proc::walking & 1U) == 0) {
      Am_Object::Am_Object(&local_48,&anim7);
      Am_Object::Am_Object(&local_50,(Am_Object *)&Am_No_Object);
      local_54 = _Am_Default_Start_Char;
      Am_Object::Am_Object(&local_60,(Am_Object *)&Am_No_Object);
      Am_Start_Interactor((Am_Object_Data *)&local_48,(Am_Object_Data *)&local_50,
                          (Am_Input_Char *)(ulong)local_54,(Am_Object_Data *)&local_60,0,0,true);
      Am_Object::~Am_Object(&local_60);
      Am_Object::~Am_Object(&local_50);
      Am_Object::~Am_Object(&local_48);
      Am_Object::Am_Object(&local_68,&change_pic_anim);
      Am_Start_Animator((Am_Object_Data *)&local_68,(Am_Value *)&Am_No_Value,
                        (Am_Value *)&Am_No_Value);
      Am_Object::~Am_Object(&local_68);
    }
    else {
      Am_Object::Am_Object(&local_38,&anim7);
      Am_Abort_Interactor((Am_Object_Data *)&local_38,true);
      Am_Object::~Am_Object(&local_38);
      Am_Object::Am_Object(&local_40,&change_pic_anim);
      Am_Abort_Animator((Am_Object_Data *)&local_40);
      Am_Object::~Am_Object(&local_40);
    }
    key_press_proc::walking = (bool)((key_press_proc::walking ^ 0xffU) & 1);
  }
  else if (local_30 == 99) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x25e8,0x107);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    Am_Object::Set(0x25e8,true,(ulong)((byte)~bVar2 & 1));
  }
  else if (local_30 == 0x4e) {
    Create_Bouncing_Button();
  }
  else if (local_30 == 0x42) {
    if ((key_press_proc::blinking & 1U) == 0) {
      Am_Object::Am_Object(&local_78,&wiggler_blink);
      Am_Start_Animator((Am_Object_Data *)&local_78,(Am_Value *)&Am_No_Value,
                        (Am_Value *)&Am_No_Value);
      Am_Object::~Am_Object(&local_78);
    }
    else {
      Am_Object::Am_Object(&local_70,&wiggler_blink);
      Am_Abort_Animator((Am_Object_Data *)&local_70);
      Am_Object::~Am_Object(&local_70);
    }
    key_press_proc::blinking = (bool)((key_press_proc::blinking ^ 0xffU) & 1);
  }
  else if (local_30 == 0x41) {
    if ((key_press_proc::visblinking & 1U) == 0) {
      Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff78,&wiggler_vis_blink);
      Am_Start_Animator((Am_Object_Data *)&stack0xffffffffffffff78,(Am_Value *)&Am_No_Value,
                        (Am_Value *)&Am_No_Value);
      Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff78);
    }
    else {
      Am_Object::Am_Object(&local_80,&wiggler_vis_blink);
      Am_Abort_Animator((Am_Object_Data *)&local_80);
      Am_Object::~Am_Object(&local_80);
      Am_Object::Set(0x24b0,true,1);
    }
    key_press_proc::visblinking = (bool)((key_press_proc::visblinking ^ 0xffU) & 1);
  }
  else if (local_30 == 0x72) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x2498,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    Am_Object::Set(0x2498,true,(ulong)((byte)~bVar2 & 1));
  }
  else if (local_30 == 0x69) {
    if ((key_press_proc::debugging & 1U) == 0) {
      Am_Set_Inter_Trace(Am_INTER_TRACE_ALL);
    }
    else {
      Am_Set_Inter_Trace(Am_INTER_TRACE_NONE);
    }
    key_press_proc::debugging = (bool)((key_press_proc::debugging ^ 0xffU) & 1);
  }
  else if (local_30 == 0x6d) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x2498,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    bVar2 = (bool)(~bVar2 & 1);
    if (key_press_proc::visibleanimationcnt - 1U < 2) {
      Am_Object::Set(0x25b0,0x66,1);
      Am_Object::Set(0x25b0,0x67,1);
      poVar5 = std::operator<<((ostream *)&std::cout," setting visible to ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar2);
      poVar5 = std::operator<<(poVar5," in X and Y");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar6,std::flush<char,std::char_traits<char>>);
    }
    else if (key_press_proc::visibleanimationcnt - 3U < 2) {
      Am_Object::Set(0x25b0,0x66,1);
      Am_Object::Set(0x25b0,(Am_Value *)0x67,(ulong)&Am_No_Value);
      poVar5 = std::operator<<((ostream *)&std::cout," setting visible to ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar2);
      poVar5 = std::operator<<(poVar5," shrink in X only");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar6,std::flush<char,std::char_traits<char>>);
    }
    else if (key_press_proc::visibleanimationcnt - 5U < 2) {
      Am_Object::Set(0x25b0,(Am_Value *)0x66,(ulong)&Am_No_Value);
      Am_Object::Set(0x25b0,0x67,1);
      poVar5 = std::operator<<((ostream *)&std::cout," setting visible to ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar2);
      poVar5 = std::operator<<(poVar5," shrink in Y only");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar6,std::flush<char,std::char_traits<char>>);
    }
    key_press_proc::visibleanimationcnt = key_press_proc::visibleanimationcnt % 6 + 1;
    Am_Object::Set(0x2498,true,(ulong)bVar2);
  }
  else if (local_30 == 0x67) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x25c0,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    Am_Object::Set(0x25c0,true,(ulong)((byte)~bVar2 & 1));
  }
  else if (local_30 == 0x62) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x25d0,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    Am_Object::Set(0x25d0,true,(ulong)((byte)~bVar2 & 1));
  }
  else if (local_30 == 0x76) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x24c8,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    Am_Object::Set(0x24c8,true,(ulong)((byte)~bVar2 & 1));
  }
  else if (local_30 == 0x56) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x25c8,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    bVar2 = (bool)(~bVar2 & 1);
    if (key_press_proc::dogvisibleanimationcnt - 1U < 2) {
      Am_Object::Set(0x25e0,100,0xfffffc18);
      Am_Object::Set(0x25e0,0x65,0xfffffc18);
      poVar5 = std::operator<<((ostream *)&std::cout,"setting visible to ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar2);
      poVar5 = std::operator<<(poVar5," from -1000,-1000 ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar6,std::flush<char,std::char_traits<char>>);
    }
    else if (key_press_proc::dogvisibleanimationcnt - 3U < 2) {
      Am_Object::Set(0x25e0,(Am_Value *)0x64,(ulong)&Am_No_Value);
      Am_Object::Set(0x25e0,0x65,100);
      poVar5 = std::operator<<((ostream *)&std::cout,"setting visible to ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar2);
      poVar5 = std::operator<<(poVar5," from Y=100 only ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar6,std::flush<char,std::char_traits<char>>);
    }
    else if (key_press_proc::dogvisibleanimationcnt - 5U < 2) {
      Am_Object::Set(0x25e0,100,500);
      Am_Object::Set(0x25e0,(Am_Value *)0x65,(ulong)&Am_No_Value);
      poVar5 = std::operator<<((ostream *)&std::cout,"setting visible to ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar2);
      poVar5 = std::operator<<(poVar5," from x=500 only ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar6,std::flush<char,std::char_traits<char>>);
    }
    key_press_proc::dogvisibleanimationcnt = key_press_proc::dogvisibleanimationcnt % 6 + 1;
    Am_Object::Set(0x25c8,true,(ulong)bVar2);
  }
  else if (local_30 == 100) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x25d8,0xcc);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    Am_Object::Set(0x25d8,true,(ulong)((byte)~bVar2 & 1));
  }
  else if (local_30 == 0x6f) {
    pAVar4 = (Am_Value *)Am_Object::Get(0x25f0,0xcc);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    Am_Object::Set(0x25f0,true,(ulong)((byte)~bVar2 & 1));
  }
  else if (local_30 == 0x70) {
    if ((key_press_proc(Am_Object)::copy_point_list == '\0') &&
       (iVar3 = __cxa_guard_acquire(&key_press_proc(Am_Object)::copy_point_list), iVar3 != 0)) {
      Am_Point_List::Am_Point_List((Am_Point_List *)key_press_proc(Am_Object)::copy_point_list);
      __cxa_atexit(Am_Point_List::~Am_Point_List,key_press_proc(Am_Object)::copy_point_list,
                   &__dso_handle);
      __cxa_guard_release(&key_press_proc(Am_Object)::copy_point_list);
    }
    pAVar7 = (Am_Value *)Am_Object::Get(0x24e0,0xb2);
    Am_Point_List::Am_Point_List((Am_Point_List *)&y1,pAVar7);
    switch(key_press_proc::polygonanimationcnt) {
    case 1:
      poVar5 = std::operator<<((ostream *)&std::cout,"<><>Adding new point to polygon old = ");
      operator<<(poVar5,(Am_Point_List *)&y1);
      Am_Point_List::Start();
      Am_Point_List::Next();
      Am_Point_List::Next();
      Am_Point_List::Get(&y1,&local_a4);
      Am_Point_List::Insert(local_a4 + -25.0,local_a8 + -50.0,(Am_Insert_Position)&y1,true);
      break;
    case 2:
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "<><>Removing the new point from polygon old = ");
      operator<<(poVar5,(Am_Point_List *)&y1);
      Am_Point_List::Start();
      Am_Point_List::Next();
      Am_Point_List::Next();
      Am_Point_List::Next();
      Am_Point_List::Delete(SUB81(&y1,0));
      break;
    case 3:
      poVar5 = std::operator<<((ostream *)&std::cout,"<><>Point list to nothing; old = ");
      operator<<(poVar5,(Am_Point_List *)&y1);
      Am_Point_List::Am_Point_List(local_b8);
      Am_Point_List::operator=((Am_Point_List *)&y1,local_b8);
      Am_Point_List::~Am_Point_List(local_b8);
      break;
    case 4:
      poVar5 = std::operator<<((ostream *)&std::cout,"<><>Point list from nothing; old = ");
      operator<<(poVar5,(Am_Point_List *)&y1);
      Am_Point_List::operator=((Am_Point_List *)&y1,(Am_Point_List *)triangle_point_list);
      break;
    case 5:
      poVar5 = std::operator<<((ostream *)&std::cout,"<><>Changing radically to be a star; old = ");
      operator<<(poVar5,(Am_Point_List *)&y1);
      Am_Point_List::operator=((Am_Point_List *)&y1,(Am_Point_List *)star_point_list);
      break;
    case 6:
      poVar5 = std::operator<<((ostream *)&std::cout,"<><>Back to triangle; old = ");
      operator<<(poVar5,(Am_Point_List *)&y1);
      Am_Point_List::operator=((Am_Point_List *)&y1,(Am_Point_List *)triangle_point_list);
    }
    key_press_proc::polygonanimationcnt = key_press_proc::polygonanimationcnt % 6 + 1;
    poVar5 = std::operator<<((ostream *)&std::cout," new = ");
    pvVar6 = (void *)operator<<(poVar5,(Am_Point_List *)&y1);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar6,std::flush<char,std::char_traits<char>>);
    pAVar8 = Am_Point_List::operator_cast_to_Am_Wrapper_((Am_Point_List *)&y1);
    Am_Object::Set(0x24e0,(Am_Wrapper *)0xb2,(ulong)pAVar8);
    Am_Point_List::~Am_Point_List((Am_Point_List *)&y1);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Commands:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"a to toggle 2D animator");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"f to toggle fixed-time animator");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"h to toggle hopping animator");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"w to toggle wiggling animator");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"s to set red rectangle\'s left & top");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"c to toggle RGB and HSV color paths");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"r to hide red rectangle\n");
    poVar5 = std::operator<<(poVar5,"i = toggle interactor (animator) tracing\n");
    poVar5 = std::operator<<(poVar5,"m = grow visible animate rectangle\n");
    poVar5 = std::operator<<(poVar5,"o = toggle animation on 1st option menu\n");
    poVar5 = std::operator<<(poVar5,"p = test polygon animation\n");
    poVar5 = std::operator<<(poVar5,"e = toggle eye walking");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"For icons:\n");
    poVar5 = std::operator<<(poVar5,"   g = toggle girl\n");
    poVar5 = std::operator<<(poVar5,"   d = toggle dog animation\n");
    poVar5 = std::operator<<(poVar5,"   b = toggle bug\n");
    poVar5 = std::operator<<(poVar5,"   v = toggle visible on group (fade out)\n");
    poVar5 = std::operator<<(poVar5,"   V = toggle visible on dog (fly away)\n");
    poVar5 = std::operator<<(poVar5," A = blink wiggler visible\n");
    poVar5 = std::operator<<(poVar5," B = blink wiggler blue and green\n");
    poVar5 = std::operator<<(poVar5," N = create new window with animated button\n");
    poVar5 = std::operator<<(poVar5,"q to quit");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar6,std::flush<char,std::char_traits<char>>);
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, key_press, (Am_Object self))
{
  Am_Object inter = self.Get_Owner();
  Am_Input_Char startc = inter.Get(Am_START_CHAR);
  int c = startc.As_Char();

  if (c == 'q')
    Am_Exit_Main_Event_Loop();
  else if (c == 's') {
    if ((int)Mover.Get(Am_LEFT) == 500) {
      Mover.Set(Am_LEFT, 175);
      Mover.Set(Am_TOP, 125);
    } else {
      Mover.Set(Am_LEFT, 500);
      Mover.Set(Am_TOP, 500);
    }
  } else if (c == 'a')
    Animator.Set(Am_VISIBLE, !(bool)Animator.Get(Am_VISIBLE));
  else if (c == 'f')
    fixed_time.Set(Am_VISIBLE, !(bool)fixed_time.Get(Am_VISIBLE));
  else if (c == 'h')
    hopper.Set(Am_VISIBLE, !(bool)hopper.Get(Am_VISIBLE));
  else if (c == 'w')
    wiggler.Set(Am_VISIBLE, !(bool)wiggler.Get(Am_VISIBLE));
  else if (c == 'e') {
    static bool walking = true;
    if (walking) {
      Am_Abort_Interactor(anim7);
      Am_Abort_Animator(change_pic_anim);
    } else {
      Am_Start_Interactor(anim7);
      Am_Start_Animator(change_pic_anim);
    }
    walking = !walking;
  } else if (c == 'c')
    coloranimation.Set(Am_RGB_COLOR, !(bool)coloranimation.Get(Am_RGB_COLOR));
  else if (c == 'N')
    Create_Bouncing_Button();
  else if (c == 'B') {
    static bool blinking = false;
    if (blinking) {
      Am_Abort_Animator(wiggler_blink);
    } else {
      Am_Start_Animator(wiggler_blink);
    }
    blinking = !blinking;
  } else if (c == 'A') {
    static bool visblinking = false;
    if (visblinking) {
      Am_Abort_Animator(wiggler_vis_blink);
      wiggler.Set(Am_VISIBLE, true); //might stop with it invisible
    } else {
      Am_Start_Animator(wiggler_vis_blink);
    }
    visblinking = !visblinking;
  } else if (c == 'r')
    Mover.Set(Am_VISIBLE, !(bool)Mover.Get(Am_VISIBLE));
  else if (c == 'i') {
    static bool debugging = false;
    if (!debugging)
      Am_Set_Inter_Trace(Am_INTER_TRACE_ALL);
    else
      Am_Set_Inter_Trace(Am_INTER_TRACE_NONE);
    debugging = !debugging;
  } else if (c == 'm') {
    static int visibleanimationcnt = 1;
    bool new_visible = !(bool)Mover.Get(Am_VISIBLE);
    switch (visibleanimationcnt) {
    case 1:
    case 2:
      rectvisibleanimation.Set(Am_WIDTH, 1);
      rectvisibleanimation.Set(Am_HEIGHT, 1);
      std::cout << " setting visible to " << new_visible << " in X and Y"
                << std::endl
                << std::flush;
      break;
    case 3:
    case 4:
      rectvisibleanimation.Set(Am_WIDTH, 1);
      rectvisibleanimation.Set(Am_HEIGHT, Am_No_Value);
      std::cout << " setting visible to " << new_visible << " shrink in X only"
                << std::endl
                << std::flush;
      break;
    case 5:
    case 6:
      rectvisibleanimation.Set(Am_WIDTH, Am_No_Value);
      rectvisibleanimation.Set(Am_HEIGHT, 1);
      std::cout << " setting visible to " << new_visible << " shrink in Y only"
                << std::endl
                << std::flush;
      break;
    }
    visibleanimationcnt = (visibleanimationcnt % 6) + 1;
    Mover.Set(Am_VISIBLE, new_visible);
  }
#ifdef TESTUSEPIXMAPS
  else if (c == 'g')
    girl.Set(Am_VISIBLE, !(bool)girl.Get(Am_VISIBLE));
  else if (c == 'b')
    bug.Set(Am_VISIBLE, !(bool)bug.Get(Am_VISIBLE));
  else if (c == 'v')
    fade_group.Set(Am_VISIBLE, !(bool)fade_group.Get(Am_VISIBLE));
  else if (c == 'V') {
    static int dogvisibleanimationcnt = 1;
    bool new_visible = !(bool)dog.Get(Am_VISIBLE);
    switch (dogvisibleanimationcnt) {
    case 1:
    case 2:
      dogvisibleanimation.Set(Am_LEFT, -1000);
      dogvisibleanimation.Set(Am_TOP, -1000);
      std::cout << "setting visible to " << new_visible << " from -1000,-1000 "
                << std::endl
                << std::flush;
      break;
    case 3:
    case 4:
      dogvisibleanimation.Set(Am_LEFT, Am_No_Value);
      dogvisibleanimation.Set(Am_TOP, 100);
      std::cout << "setting visible to " << new_visible << " from Y=100 only "
                << std::endl
                << std::flush;
      break;
    case 5:
    case 6:
      dogvisibleanimation.Set(Am_LEFT, 500);
      dogvisibleanimation.Set(Am_TOP, Am_No_Value);
      std::cout << "setting visible to " << new_visible << " from x=500 only "
                << std::endl
                << std::flush;
      break;
    }
    dogvisibleanimationcnt = (dogvisibleanimationcnt % 6) + 1;
    dog.Set(Am_VISIBLE, new_visible);
  } else if (c == 'd')
    doganimation.Set(Am_ACTIVE, !(bool)doganimation.Get(Am_ACTIVE));
  else if (c == 'o')
    optionvisibleanimation.Set(Am_ACTIVE,
                               !(bool)optionvisibleanimation.Get(Am_ACTIVE));
#endif
  else if (c == 'p') {
    static int polygonanimationcnt = 1;
    static Am_Point_List copy_point_list;
    Am_Point_List pl = polygon.Get(Am_POINT_LIST);

    float x1, y1;
    switch (polygonanimationcnt) {
    case 1: {
      std::cout << "<><>Adding new point to polygon old = " << pl;
      pl.Start();
      pl.Next();
      pl.Next();
      pl.Get(x1, y1);
      pl.Insert(x1 - 25, y1 - 50, Am_AFTER);
      break;
    }
    case 2: {
      std::cout << "<><>Removing the new point from polygon old = " << pl;
      pl.Start();
      pl.Next();
      pl.Next();
      pl.Next();
      pl.Delete();
      break;
    }
    case 3: {
      std::cout << "<><>Point list to nothing; old = " << pl;
      pl = Am_Point_List(); // empty list
      break;
    }
    case 4: {
      std::cout << "<><>Point list from nothing; old = " << pl;
      pl = triangle_point_list;
      break;
    }
    case 5: {
      std::cout << "<><>Changing radically to be a star; old = " << pl;
      pl = star_point_list;
      break;
    }
    case 6: {
      std::cout << "<><>Back to triangle; old = " << pl;
      pl = triangle_point_list;
      break;
    }
    }
    polygonanimationcnt = (polygonanimationcnt % 6) + 1;
    std::cout << " new = " << pl << std::endl << std::flush;
    polygon.Set(Am_POINT_LIST, pl);
  } else
    std::cout << "Commands:" << std::endl
              << "a to toggle 2D animator" << std::endl
              << "f to toggle fixed-time animator" << std::endl
              << "h to toggle hopping animator" << std::endl
              << "w to toggle wiggling animator" << std::endl
              << "s to set red rectangle's left & top" << std::endl
              << "c to toggle RGB and HSV color paths" << std::endl
              << "r to hide red rectangle\n"
              << "i = toggle interactor (animator) tracing\n"
              << "m = grow visible animate rectangle\n"
              << "o = toggle animation on 1st option menu\n"
              << "p = test polygon animation\n"
              << "e = toggle eye walking" << std::endl
#ifdef TESTUSEPIXMAPS
              << "For icons:\n"
              << "   g = toggle girl\n"
              << "   d = toggle dog animation\n"
              << "   b = toggle bug\n"
              << "   v = toggle visible on group (fade out)\n"
              << "   V = toggle visible on dog (fly away)\n"
#endif
              << " A = blink wiggler visible\n"
              << " B = blink wiggler blue and green\n"
              << " N = create new window with animated button\n"
              << "q to quit" << std::endl
              << std::flush;
}